

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall Fl_Tree_Item::prev_visible(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  Fl_Tree_Item *pFVar1;
  Fl_Tree_Item *pFVar2;
  
  while( true ) {
    this = prev(this);
    if (this == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    pFVar1 = this->_parent;
    if (pFVar1 == (Fl_Tree_Item *)0x0) break;
    if (this->_visible != '\0') {
      for (pFVar2 = pFVar1->_parent; pFVar2 != (Fl_Tree_Item *)0x0; pFVar2 = pFVar2->_parent) {
        if (pFVar1->_open == '\0') {
          this = pFVar1;
        }
        pFVar1 = pFVar2;
      }
      return this;
    }
  }
  if (prefs->_showroot == '\0') {
    return (Fl_Tree_Item *)0x0;
  }
  if (this->_visible == '\0') {
    return (Fl_Tree_Item *)0x0;
  }
  return this;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::prev_visible(Fl_Tree_Prefs &prefs) {
  Fl_Tree_Item *c = this;
  while ( c ) {
    c = c->prev();					// previous item
    if ( !c ) break;					// no more items? done
    if ( c->is_root() )					// root
      return((prefs.showroot()&&c->visible()) ? c : 0);	// return root if visible
    if ( !c->visible() ) continue;			// item not visible? skip
    // Check all parents to be sure none are closed.
    // If closed, move up to that level and repeat until sure none are closed.
    Fl_Tree_Item *p = c->parent();
    while (1) {
      if ( !p || p->is_root() ) return(c);		// hit top? then we're displayed, return c
      if ( p->is_close() ) c = p;			// found closed parent? make it current
      p = p->parent();					// continue up tree
    }
  }
  return(0);						// hit end: no more items
}